

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

bool __thiscall
flatbuffers::Parser::TryTypedValue(Parser *this,int dtoken,bool check,Value *e,BaseType req)

{
  allocator local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  byte local_25;
  BaseType local_24;
  bool match;
  Value *pVStack_20;
  BaseType req_local;
  Value *e_local;
  bool check_local;
  Parser *pPStack_10;
  int dtoken_local;
  Parser *this_local;
  
  local_25 = dtoken == this->token_;
  if ((bool)local_25) {
    local_24 = req;
    pVStack_20 = e;
    e_local._3_1_ = check;
    e_local._4_4_ = dtoken;
    pPStack_10 = this;
    std::__cxx11::string::operator=((string *)&e->constant,(string *)&this->attribute_);
    if ((e_local._3_1_ & 1) == 0) {
      if ((pVStack_20->type).base_type == BASE_TYPE_NONE) {
        (pVStack_20->type).base_type = local_24;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_a8,"type mismatch: expecting: ",&local_a9);
        std::operator+(&local_88,&local_a8,
                       *(char **)(kTypeNames + (ulong)(pVStack_20->type).base_type * 8));
        std::operator+(&local_68,&local_88,", found: ");
        std::operator+(&local_48,&local_68,*(char **)(kTypeNames + (ulong)local_24 * 8));
        Error(&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      }
    }
    Next(this);
  }
  return (bool)(local_25 & 1);
}

Assistant:

bool Parser::TryTypedValue(int dtoken,
                           bool check,
                           Value &e,
                           BaseType req) {
  bool match = dtoken == token_;
  if (match) {
    e.constant = attribute_;
    if (!check) {
      if (e.type.base_type == BASE_TYPE_NONE) {
        e.type.base_type = req;
      } else {
        Error(std::string("type mismatch: expecting: ") +
              kTypeNames[e.type.base_type] +
              ", found: " +
              kTypeNames[req]);
      }
    }
    Next();
  }
  return match;
}